

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O0

int setup_idp(X509_CRL *crl,ISSUING_DIST_POINT *idp)

{
  DIST_POINT_NAME *dpn;
  byte bVar1;
  int iVar2;
  X509_NAME *iname;
  int idp_only;
  ISSUING_DIST_POINT *idp_local;
  X509_CRL *crl_local;
  
  crl->idp_flags = crl->idp_flags | 1;
  bVar1 = 0 < idp->onlyuser;
  if ((bool)bVar1) {
    crl->idp_flags = crl->idp_flags | 4;
  }
  if (0 < idp->onlyCA) {
    bVar1 = bVar1 + 1;
    crl->idp_flags = crl->idp_flags | 8;
  }
  if (0 < idp->onlyattr) {
    bVar1 = bVar1 + 1;
    crl->idp_flags = crl->idp_flags | 0x10;
  }
  if (1 < bVar1) {
    crl->idp_flags = crl->idp_flags | 2;
  }
  if (0 < idp->indirectCRL) {
    crl->idp_flags = crl->idp_flags | 0x20;
  }
  if (idp->onlysomereasons != (ASN1_BIT_STRING *)0x0) {
    crl->idp_flags = crl->idp_flags | 0x40;
  }
  dpn = idp->distpoint;
  iname = X509_CRL_get_issuer(crl);
  iVar2 = DIST_POINT_set_dpname((DIST_POINT_NAME *)dpn,(X509_NAME *)iname);
  return iVar2;
}

Assistant:

static int setup_idp(X509_CRL *crl, ISSUING_DIST_POINT *idp) {
  int idp_only = 0;
  // Set various flags according to IDP
  crl->idp_flags |= IDP_PRESENT;
  if (idp->onlyuser > 0) {
    idp_only++;
    crl->idp_flags |= IDP_ONLYUSER;
  }
  if (idp->onlyCA > 0) {
    idp_only++;
    crl->idp_flags |= IDP_ONLYCA;
  }
  if (idp->onlyattr > 0) {
    idp_only++;
    crl->idp_flags |= IDP_ONLYATTR;
  }

  // Per RFC 5280, section 5.2.5, at most one of onlyContainsUserCerts,
  // onlyContainsCACerts, and onlyContainsAttributeCerts may be true.
  //
  // TODO(crbug.com/boringssl/443): Move this check to the |ISSUING_DIST_POINT|
  // parser.
  if (idp_only > 1) {
    crl->idp_flags |= IDP_INVALID;
  }

  if (idp->indirectCRL > 0) {
    crl->idp_flags |= IDP_INDIRECT;
  }

  if (idp->onlysomereasons) {
    crl->idp_flags |= IDP_REASONS;
  }

  // TODO(davidben): The new verifier does not support nameRelativeToCRLIssuer.
  // Remove this?
  return DIST_POINT_set_dpname(idp->distpoint, X509_CRL_get_issuer(crl));
}